

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis256.cc
# Opt level: O2

int aead_aegis_256_open_gather
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,
              size_t in_len,uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len)

{
  size_t mlen;
  int iVar1;
  int line;
  ulong uVar2;
  uint local_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  size_t local_118;
  uint8_t local_110 [16];
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint8_t local_90 [96];
  
  if (nonce_len < 0x21) {
    if (ctx->tag_len == in_tag_len) {
      local_118 = in_len;
      aegis_256_state_init((ctx->state).opaque,nonce,nonce_len,(aes_block_t *)&local_100);
      for (uVar2 = 0x10; uVar2 <= ad_len; uVar2 = uVar2 + 0x10) {
        aead_aegis_256_enc((uint8_t *)&local_130,ad,(aes_block_t *)&local_100);
        ad = ad + 0x10;
      }
      uVar2 = ad_len & 0xf;
      if (uVar2 != 0) {
        memset(local_110 + uVar2,0,0x10 - uVar2);
        memcpy(local_110,ad,uVar2);
        aead_aegis_256_enc((uint8_t *)&local_130,local_110,(aes_block_t *)&local_100);
      }
      mlen = local_118;
      for (uVar2 = 0x10; uVar2 <= mlen; uVar2 = uVar2 + 0x10) {
        aead_aegis_256_dec(out,in,(aes_block_t *)&local_100);
        in = in + 0x10;
        out = out + 0x10;
      }
      uVar2 = mlen & 0xf;
      if (uVar2 != 0) {
        memset((void *)((long)&local_130 + uVar2),0,0x10 - uVar2);
        memcpy(&local_130,in,uVar2);
        aead_aegis_256_dec((uint8_t *)&local_130,(uint8_t *)&local_130,(aes_block_t *)&local_100);
        memcpy(out,&local_130,uVar2);
        memset(&local_130,0,uVar2);
        local_100 = local_130 ^ local_100;
        uStack_fc = uStack_12c ^ uStack_fc;
        uStack_f8 = uStack_128 ^ uStack_f8;
        uStack_f4 = uStack_124 ^ uStack_f4;
      }
      aead_aegis_256_tag(local_90,ad_len,mlen,(aes_block_t *)&local_100);
      iVar1 = CRYPTO_memcmp(local_90,in_tag,in_tag_len);
      if (iVar1 == 0) {
        return 1;
      }
      iVar1 = 0x65;
      line = 0x15a;
    }
    else {
      iVar1 = 0x65;
      line = 0x13a;
    }
  }
  else {
    iVar1 = 0x79;
    line = 0x136;
  }
  ERR_put_error(0x1e,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis256.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_aegis_256_open_gather(const EVP_AEAD_CTX *ctx, uint8_t *out,
                                      const uint8_t *nonce, size_t nonce_len,
                                      const uint8_t *in, size_t in_len,
                                      const uint8_t *in_tag, size_t in_tag_len,
                                      const uint8_t *ad, size_t ad_len) {
  const struct aead_aegis_256_ctx *aegis_ctx =
      (struct aead_aegis_256_ctx *)&ctx->state;

  return aegis_256_open_gather(aegis_ctx->key, out, nonce, nonce_len, in,
                               in_len, in_tag, in_tag_len, ad, ad_len,
                               ctx->tag_len);
}